

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O2

void __thiscall
embree::Instantiator::instantiate(Instantiator *this,Ref<embree::SceneGraph::GroupNode> *group)

{
  element_type *peVar1;
  GroupNode *this_00;
  int iVar2;
  int iVar3;
  TransformNode *this_01;
  ulong uVar4;
  float fVar5;
  Vec2f VVar6;
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar10 [12];
  undefined1 auVar9 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  AffineSpace3fa space;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_f0;
  float local_e4;
  Ref<embree::SceneGraph::GroupNode> *local_e0;
  anon_union_8_2_4062524c_for_Vec2<float>_1 local_d8;
  undefined8 local_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_e0 = group;
  for (uVar4 = 0; uVar4 < this->N; uVar4 = uVar4 + 1) {
    iVar2 = rand();
    iVar3 = rand();
    auVar10 = (undefined1  [12])0x0;
    local_d0 = CONCAT44((float)iVar3 * 4.656613e-10,(float)iVar2 * 4.656613e-10);
    VVar6 = Distribution2D::sample
                      ((Distribution2D *)&local_f0.field_0,
                       (Vec2f *)(this->dist).
                                super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr);
    peVar1 = (this->dist).super___shared_ptr<embree::Distribution2D,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    auVar15._0_4_ = (float)peVar1->height;
    auVar9._0_4_ = (float)peVar1->width;
    auVar9._4_12_ = auVar10;
    auVar13._0_8_ = auVar9._0_8_;
    auVar13._8_4_ = auVar10._0_4_;
    auVar13._12_4_ = VVar6.field_0._4_4_;
    auVar7._8_8_ = auVar13._8_8_;
    auVar7._4_4_ = auVar15._0_4_;
    auVar7._0_4_ = auVar9._0_4_;
    auVar12._4_4_ = auVar15._0_4_;
    auVar12._0_4_ = auVar9._0_4_;
    auVar12._8_4_ = auVar10._0_4_;
    auVar12._12_4_ = VVar6.field_0._4_4_;
    auVar13 = rcpss(auVar12,auVar7);
    auVar15._4_4_ = auVar15._0_4_;
    auVar15._8_4_ = auVar15._0_4_;
    auVar15._12_4_ = auVar15._0_4_;
    auVar7 = rcpss(auVar15,auVar15);
    fVar5 = local_f0.field_0.y;
    local_f0._0_4_ = local_f0.field_0.x * (2.0 - auVar9._0_4_ * auVar13._0_4_) * auVar13._0_4_;
    local_f0._4_4_ = fVar5 * (2.0 - auVar15._0_4_ * auVar7._0_4_) * auVar7._0_4_;
    iVar2 = rand();
    fVar5 = (float)iVar2 * 4.656613e-10 * 6.2831855;
    local_d8 = local_f0;
    HeightField::get((AffineSpace3fa *)&local_b8.field_1,(this->heightField).ptr,
                     (Vec2f *)&local_d8.field_0);
    auVar14._0_12_ = ZEXT812(0x3f800000);
    auVar14._12_4_ = 0;
    auVar15 = rsqrtss(auVar14,auVar14);
    fVar8 = auVar15._0_4_;
    fStack_bc = fVar8 * fVar8 * fVar8 * -0.5 + fVar8 * 1.5;
    local_c8 = fStack_bc * 0.0;
    fStack_c4 = fStack_bc * 1.0;
    fStack_c0 = fStack_bc * 0.0;
    fStack_bc = fStack_bc * 0.0;
    local_e4 = sinf(fVar5);
    fVar5 = cosf(fVar5);
    fVar8 = (1.0 - local_c8 * local_c8) * fVar5 + local_c8 * local_c8;
    fVar21 = 1.0 - fVar5;
    fVar17 = local_c8 * fStack_c4 * fVar21;
    fVar11 = fVar17 - local_e4 * fStack_c0;
    fVar20 = local_c8 * fStack_c0 * fVar21;
    fVar16 = fVar20 + local_e4 * fStack_c4;
    fVar17 = local_e4 * fStack_c0 + fVar17;
    fVar19 = (1.0 - fStack_c4 * fStack_c4) * fVar5 + fStack_c4 * fStack_c4;
    fVar21 = fStack_c4 * fStack_c0 * fVar21;
    fVar18 = fVar21 - local_c8 * local_e4;
    fVar20 = fVar20 - local_e4 * fStack_c4;
    fVar21 = local_c8 * local_e4 + fVar21;
    fVar5 = (1.0 - fStack_c0 * fStack_c0) * fVar5 + fStack_c0 * fStack_c0;
    local_78.m128[0] = fVar8 * local_b8.m128[0] + fVar17 * local_a8 + fVar20 * local_98;
    local_78.m128[1] = fVar8 * local_b8.m128[1] + fVar17 * fStack_a4 + fVar20 * fStack_94;
    local_78.m128[2] = fVar8 * local_b8.m128[2] + fVar17 * fStack_a0 + fVar20 * fStack_90;
    local_78.m128[3] = fVar8 * local_b8.m128[3] + fVar17 * fStack_9c + fVar20 * fStack_8c;
    local_68 = fVar11 * local_b8.m128[0] + fVar19 * local_a8 + fVar21 * local_98;
    fStack_64 = fVar11 * local_b8.m128[1] + fVar19 * fStack_a4 + fVar21 * fStack_94;
    fStack_60 = fVar11 * local_b8.m128[2] + fVar19 * fStack_a0 + fVar21 * fStack_90;
    fStack_5c = fVar11 * local_b8.m128[3] + fVar19 * fStack_9c + fVar21 * fStack_8c;
    local_58 = fVar16 * local_b8.m128[0] + fVar18 * local_a8 + fVar5 * local_98;
    fStack_54 = fVar16 * local_b8.m128[1] + fVar18 * fStack_a4 + fVar5 * fStack_94;
    fStack_50 = fVar16 * local_b8.m128[2] + fVar18 * fStack_a0 + fVar5 * fStack_90;
    fStack_4c = fVar16 * local_b8.m128[3] + fVar18 * fStack_9c + fVar5 * fStack_8c;
    local_48 = local_b8.m128[0] * 0.0 + local_a8 * 0.0 + local_98 * 0.0 + local_88;
    fStack_44 = local_b8.m128[1] * 0.0 + fStack_a4 * 0.0 + fStack_94 * 0.0 + fStack_84;
    fStack_40 = local_b8.m128[2] * 0.0 + fStack_a0 * 0.0 + fStack_90 * 0.0 + fStack_80;
    fStack_3c = local_b8.m128[3] * 0.0 + fStack_9c * 0.0 + fStack_8c * 0.0 + fStack_7c;
    this_00 = local_e0->ptr;
    this_01 = (TransformNode *)SceneGraph::TransformNode::operator_new(0xa0);
    SceneGraph::TransformNode::TransformNode
              (this_01,(AffineSpace3fa *)&local_78.field_1,&this->object);
    local_b8._0_8_ = this_01;
    (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
    SceneGraph::GroupNode::add(this_00,(Ref<embree::SceneGraph::Node> *)&local_b8.field_1);
    if ((TransformNode *)local_b8._0_8_ != (TransformNode *)0x0) {
      (**(code **)(*(long *)local_b8._0_8_ + 0x18))();
    }
  }
  return;
}

Assistant:

void instantiate(Ref<SceneGraph::GroupNode>& group) 
    {
      for (size_t i=0; i<N; i++) 
      {
        Vec2f r = Vec2f(random<float>(),random<float>());
        Vec2f p = dist->sample(r);
        p.x *= rcp(float(dist->width)); p.y *= rcp(float(dist->height));
        float angle = 2.0f*float(pi)*random<float>();
        const AffineSpace3fa space = heightField->get(p)*AffineSpace3fa::rotate(Vec3fa(0,1,0),angle);
        group->add(new SceneGraph::TransformNode(space,object));
      }
    }